

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

int __thiscall deqp::gls::TextureBufferCase::init(TextureBufferCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  bool bVar2;
  ContextType CVar3;
  int iVar4;
  int extraout_EAX;
  ShaderProgram *pSVar5;
  NotSupportedError *pNVar6;
  TestError *pTVar7;
  char *pcVar8;
  allocator<char> local_72;
  allocator<char> local_71;
  ScopedLogSection section;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> info;
  string local_58;
  string local_38;
  
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
       glu::ContextInfo::create(this->m_renderCtx);
  CVar3.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x133);
  if (!bVar2) {
    CVar3.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    bVar2 = glu::contextSupports(CVar3,(ApiType)0x13);
    if (bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (info.
                         super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                         m_data.ptr,"GL_EXT_texture_buffer");
      if (bVar2) goto LAB_0151ad01;
    }
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"Texture buffers not supported",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x3c7);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0151ad01:
  iVar4 = (*(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.
            ptr)->_vptr_ContextInfo[2])
                    (info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                     m_data.ptr,0x8c2b);
  if (iVar4 < 1) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"GL_MAX_TEXTURE_BUFFER_SIZE > 0 required",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x3cc);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_preRender != RENDERBITS_NONE) {
    pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    pcVar8 = "Primary render program";
    if (this->m_postRender == RENDERBITS_NONE) {
      pcVar8 = "Render program";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar8,&local_71);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar8,&local_72);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    pSVar5 = anon_unknown_1::createRenderProgram(this->m_renderCtx,this->m_preRender);
    this->m_preRenderProgram = pSVar5;
    glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,pSVar5);
    if ((this->m_preRenderProgram->m_program).m_info.linkOk == false) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,(char *)0x0,"m_preRenderProgram->isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                 ,0x3d8);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  if (this->m_postRender != RENDERBITS_NONE) {
    if (this->m_preRender == this->m_postRender) {
      this->m_postRenderProgram = this->m_preRenderProgram;
    }
    else {
      pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      pcVar8 = "Secondary render program";
      if (this->m_preRender == RENDERBITS_NONE) {
        pcVar8 = "Render program";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar8,&local_71);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar8,&local_72);
      tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      pSVar5 = anon_unknown_1::createRenderProgram(this->m_renderCtx,this->m_postRender);
      this->m_postRenderProgram = pSVar5;
      glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,pSVar5);
      if ((this->m_postRenderProgram->m_program).m_info.linkOk == false) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,(char *)0x0,"m_postRenderProgram->isOk()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x3eb);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section);
    }
  }
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>);
  return extraout_EAX;
}

Assistant:

void TextureBufferCase::init (void)
{
	de::UniquePtr<glu::ContextInfo> info (glu::ContextInfo::create(m_renderCtx));

	if (!glu::contextSupports(m_renderCtx.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE))
		&& !(glu::contextSupports(m_renderCtx.getType(), glu::ApiType(3, 1, glu::PROFILE_ES)) && info->isExtensionSupported("GL_EXT_texture_buffer")))
		throw tcu::NotSupportedError("Texture buffers not supported", "", __FILE__, __LINE__);

	{
		const int maxTextureBufferSize = info->getInt(GL_MAX_TEXTURE_BUFFER_SIZE);
		if (maxTextureBufferSize <= 0)
			TCU_THROW(NotSupportedError, "GL_MAX_TEXTURE_BUFFER_SIZE > 0 required");
	}

	if (m_preRender != 0)
	{
		TestLog&					log			= m_testCtx.getLog();
		const char* const			sectionName	= (m_postRender != 0 ? "Primary render program" : "Render program");
		const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

		m_preRenderProgram = createRenderProgram(m_renderCtx, m_preRender);
		m_testCtx.getLog() << (*m_preRenderProgram);

		TCU_CHECK(m_preRenderProgram->isOk());
	}

	if (m_postRender != 0)
	{
		// Reusing program
		if (m_preRender == m_postRender)
		{
			m_postRenderProgram = m_preRenderProgram;
		}
		else
		{
			TestLog&					log			= m_testCtx.getLog();
			const char* const			sectionName	= (m_preRender!= 0 ? "Secondary render program" : "Render program");
			const tcu::ScopedLogSection	section		(log, sectionName, sectionName);

			m_postRenderProgram = createRenderProgram(m_renderCtx, m_postRender);
			m_testCtx.getLog() << (*m_postRenderProgram);

			TCU_CHECK(m_postRenderProgram->isOk());
		}
	}
}